

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo
          (DescriptorKeyInfo *this,ExtPrivkey *ext_privkey,string *parent_key_information,
          string *path)

{
  uint32_t uVar1;
  uint8_t uVar2;
  undefined3 uVar3;
  uint32_t uVar4;
  NetType NVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->key_type_ = kDescriptorKeyBip32Priv;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->extprivkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ext_privkey);
  uVar1 = ext_privkey->fingerprint_;
  uVar2 = ext_privkey->depth_;
  uVar3 = *(undefined3 *)&ext_privkey->field_0x21;
  uVar4 = ext_privkey->child_num_;
  (this->extprivkey_).version_ = ext_privkey->version_;
  (this->extprivkey_).fingerprint_ = uVar1;
  (this->extprivkey_).depth_ = uVar2;
  *(undefined3 *)&(this->extprivkey_).field_0x21 = uVar3;
  (this->extprivkey_).child_num_ = uVar4;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extprivkey_).chaincode_.data_,&(ext_privkey->chaincode_).data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&(this->extprivkey_).privkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ext_privkey->privkey_);
  uVar3 = *(undefined3 *)&(ext_privkey->privkey_).field_0x19;
  NVar5 = (ext_privkey->privkey_).net_type_;
  (this->extprivkey_).privkey_.is_compressed_ = (ext_privkey->privkey_).is_compressed_;
  *(undefined3 *)&(this->extprivkey_).privkey_.field_0x19 = uVar3;
  (this->extprivkey_).privkey_.net_type_ = NVar5;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->extprivkey_).tweak_sum_.data_,&(ext_privkey->tweak_sum_).data_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  (this->parent_info_)._M_dataplus._M_p = (pointer)&(this->parent_info_).field_2;
  (this->parent_info_)._M_string_length = 0;
  (this->parent_info_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  (this->key_string_)._M_dataplus._M_p = (pointer)&(this->key_string_).field_2;
  (this->key_string_)._M_string_length = 0;
  (this->key_string_).field_2._M_local_buf[0] = '\0';
  if (parent_key_information->_M_string_length != 0) {
    ::std::__cxx11::string::_M_assign((string *)&this->parent_info_);
  }
  if (path->_M_string_length != 0) {
    if (*(path->_M_dataplus)._M_p == '/') {
      ::std::__cxx11::string::_M_assign((string *)&this->path_);
    }
    else {
      ::std::operator+(&local_50,"/",path);
      ::std::__cxx11::string::operator=((string *)&this->path_,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(
    const ExtPrivkey& ext_privkey, const std::string parent_key_information,
    const std::string path)
    : key_type_(DescriptorKeyType::kDescriptorKeyBip32Priv),
      extprivkey_(ext_privkey) {
  if (!parent_key_information.empty()) {
    parent_info_ = parent_key_information;
  }
  if (!path.empty()) {
    if (path[0] != '/') {
      path_ = "/" + path;
    } else {
      path_ = path;
    }
  }
}